

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearraymatcher.cpp
# Opt level: O0

void __thiscall QByteArrayMatcher::QByteArrayMatcher(QByteArrayMatcher *this,QByteArray *pattern)

{
  char *pcVar1;
  qsizetype qVar2;
  uchar *skiptable;
  QByteArray *in_RSI;
  uchar *in_RDI;
  QByteArray *in_stack_ffffffffffffffd0;
  qsizetype in_stack_ffffffffffffffe8;
  
  in_RDI[0] = '\0';
  in_RDI[1] = '\0';
  in_RDI[2] = '\0';
  in_RDI[3] = '\0';
  in_RDI[4] = '\0';
  in_RDI[5] = '\0';
  in_RDI[6] = '\0';
  in_RDI[7] = '\0';
  QByteArray::QByteArray(in_stack_ffffffffffffffd0,(QByteArray *)(in_RDI + 8));
  pcVar1 = QByteArray::constData((QByteArray *)0x4c143f);
  skiptable = in_RDI + 0x20;
  *(char **)(in_RDI + 0x120) = pcVar1;
  qVar2 = QByteArray::size(in_RSI);
  *(qsizetype *)(in_RDI + 0x128) = qVar2;
  bm_init_skiptable(in_RDI,in_stack_ffffffffffffffe8,skiptable);
  return;
}

Assistant:

QByteArrayMatcher::QByteArrayMatcher(const QByteArray &pattern)
    : d(nullptr), q_pattern(pattern)
{
    p.p = reinterpret_cast<const uchar *>(pattern.constData());
    p.l = pattern.size();
    bm_init_skiptable(p.p, p.l, p.q_skiptable);
}